

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

void __thiscall
GEO::Delaunay::InvalidDimension::InvalidDimension
          (InvalidDimension *this,coord_index_t dimension,char *name,char *expected)

{
  ostream *poVar1;
  size_t sVar2;
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Invalid dimension: dimension ",0x1d);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," is not supported by the ",0x19);
  if (name == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)poVar1->_vptr_basic_ostream[-3]);
  }
  else {
    sVar2 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,name,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1," algorithm. Supported dimension(s): ",0x24);
  if (expected == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)poVar1->_vptr_basic_ostream[-3]);
  }
  else {
    sVar2 = strlen(expected);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,expected,sVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  std::logic_error::logic_error(&this->super_logic_error,(string *)local_1c0);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0]);
  }
  *(undefined ***)this = &PTR__logic_error_001a77c0;
  return;
}

Assistant:

Delaunay::InvalidDimension::InvalidDimension(
        coord_index_t dimension,
        const char* name,
        const char* expected
    ) :
        std::logic_error(invalid_dimension_error(dimension, name, expected)) {
    }